

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e03bb::ParameterPackExpansion::printLeft
          (ParameterPackExpansion *this,OutputStream *S)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Node *pNVar4;
  char *pcVar5;
  uint uVar6;
  size_t sVar7;
  
  uVar1 = S->CurrentPackIndex;
  uVar2 = S->CurrentPackMax;
  S->CurrentPackIndex = 0xffffffff;
  S->CurrentPackMax = 0xffffffff;
  sVar7 = S->CurrentPosition;
  pNVar4 = this->Child;
  (*pNVar4->_vptr_Node[4])(pNVar4);
  if (pNVar4->RHSComponentCache != No) {
    (*pNVar4->_vptr_Node[5])(pNVar4,S);
  }
  uVar3 = S->CurrentPackMax;
  if (uVar3 == 0xffffffff) {
    OutputStream::grow(S,3);
    pcVar5 = S->Buffer;
    sVar7 = S->CurrentPosition;
    pcVar5[sVar7 + 2] = '.';
    pcVar5 = pcVar5 + sVar7;
    pcVar5[0] = '.';
    pcVar5[1] = '.';
    sVar7 = S->CurrentPosition + 3;
  }
  else if (uVar3 != 0) {
    if (1 < uVar3) {
      uVar6 = 1;
      do {
        OutputStream::grow(S,2);
        pcVar5 = S->Buffer;
        sVar7 = S->CurrentPosition;
        (pcVar5 + sVar7)[0] = ',';
        (pcVar5 + sVar7)[1] = ' ';
        S->CurrentPosition = S->CurrentPosition + 2;
        S->CurrentPackIndex = uVar6;
        pNVar4 = this->Child;
        (*pNVar4->_vptr_Node[4])(pNVar4,S);
        if (pNVar4->RHSComponentCache != No) {
          (*pNVar4->_vptr_Node[5])(pNVar4,S);
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    goto LAB_001935f5;
  }
  S->CurrentPosition = sVar7;
LAB_001935f5:
  S->CurrentPackMax = uVar2;
  S->CurrentPackIndex = uVar1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    constexpr unsigned Max = std::numeric_limits<unsigned>::max();
    SwapAndRestore<unsigned> SavePackIdx(S.CurrentPackIndex, Max);
    SwapAndRestore<unsigned> SavePackMax(S.CurrentPackMax, Max);
    size_t StreamPos = S.getCurrentPosition();

    // Print the first element in the pack. If Child contains a ParameterPack,
    // it will set up S.CurrentPackMax and print the first element.
    Child->print(S);

    // No ParameterPack was found in Child. This can occur if we've found a pack
    // expansion on a <function-param>.
    if (S.CurrentPackMax == Max) {
      S += "...";
      return;
    }

    // We found a ParameterPack, but it has no elements. Erase whatever we may
    // of printed.
    if (S.CurrentPackMax == 0) {
      S.setCurrentPosition(StreamPos);
      return;
    }

    // Else, iterate through the rest of the elements in the pack.
    for (unsigned I = 1, E = S.CurrentPackMax; I < E; ++I) {
      S += ", ";
      S.CurrentPackIndex = I;
      Child->print(S);
    }
  }